

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O0

key_decoder * __thiscall unodb::key_decoder::decode(key_decoder *this,uint16_t *v)

{
  unsigned_short uVar1;
  uint16_t u;
  uint16_t *v_local;
  key_decoder *this_local;
  
  uVar1 = detail::bswap<unsigned_short>(*(undefined2 *)(this->buf + this->off));
  *v = uVar1;
  this->off = this->off + 2;
  return this;
}

Assistant:

key_decoder &decode(std::uint16_t &v) noexcept {
    std::uint16_t u;
    std::memcpy(&u, buf + off, sizeof(u));
#ifdef UNODB_DETAIL_LITTLE_ENDIAN
    v = unodb::detail::bswap(u);
#else
    v = u;
#endif
    off += sizeof(u);
    return *this;
  }